

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O0

void __thiscall
Diligent::ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>::Initialize
          (ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void> *this,
          PipelineResourceSignatureType *Signature,IMemoryAllocator *Allocator,size_t Size)

{
  int iVar1;
  Char *Message;
  undefined4 extraout_var;
  void *pRawMem;
  undefined1 local_48 [8];
  string msg;
  size_t Size_local;
  IMemoryAllocator *Allocator_local;
  PipelineResourceSignatureType *Signature_local;
  ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void> *this_local;
  
  msg.field_2._8_8_ = Size;
  if (this->m_pSignature != (PipelineResourceSignatureType *)0x0) {
    FormatString<char[26],char[24]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pSignature == nullptr",(char (*) [24])Size);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"Initialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0x345);
    std::__cxx11::string::~string((string *)local_48);
  }
  this->m_pSignature = Signature;
  if (msg.field_2._8_8_ != 0) {
    iVar1 = (**Allocator->_vptr_IMemoryAllocator)
                      (Allocator,msg.field_2._8_8_,"Memory buffer for shader variables",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                       ,0x34a);
    this->m_pVariables = (void *)CONCAT44(extraout_var,iVar1);
  }
  this->m_pDbgAllocator = Allocator;
  return;
}

Assistant:

void Initialize(const PipelineResourceSignatureType& Signature, IMemoryAllocator& Allocator, size_t Size)
    {
        VERIFY_EXPR(m_pSignature == nullptr);
        m_pSignature = &Signature;

        if (Size > 0)
        {
            void* pRawMem = ALLOCATE_RAW(Allocator, "Memory buffer for shader variables", Size);
            m_pVariables  = reinterpret_cast<VariableType*>(pRawMem);
        }

#ifdef DILIGENT_DEBUG
        m_pDbgAllocator = &Allocator;
#endif
    }